

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void display_monster(wchar_t col,wchar_t row,_Bool cursor,wchar_t oid)

{
  uint8_t attr_00;
  monster_race *pmVar1;
  monster_lore *pmVar2;
  _Bool _Var3;
  wchar_t wVar4;
  char *pcVar5;
  wchar_t local_38;
  byte local_32;
  wchar_t c;
  uint8_t a;
  uint8_t attr;
  monster_lore *lore;
  monster_race *race;
  wchar_t r_idx;
  wchar_t oid_local;
  _Bool cursor_local;
  wchar_t row_local;
  wchar_t col_local;
  
  wVar4 = default_item_id(oid);
  pmVar2 = l_list;
  pmVar1 = r_info;
  attr_00 = curs_attrs[1][(int)(uint)cursor];
  local_32 = monster_x_attr[r_info[wVar4].ridx];
  local_38 = monster_x_char[r_info[wVar4].ridx];
  if ((tile_height == '\x01') || ((local_32 & 0x80) == 0)) {
    if ((((player->opts).opt[0x10] & 1U) != 0) &&
       (((local_32 & 0x80) == 0 &&
        (_Var3 = flag_has_dbg(r_info[wVar4].flags,0xb,1,"race->flags","RF_UNIQUE"), _Var3)))) {
      local_32 = 0x11;
    }
  }
  else {
    local_32 = r_info[wVar4].d_attr;
    local_38 = r_info[wVar4].d_char;
    if ((((player->opts).opt[0x10] & 1U) != 0) &&
       (_Var3 = flag_has_dbg(r_info[wVar4].flags,0xb,1,"race->flags","RF_UNIQUE"), _Var3)) {
      local_32 = 0x11;
    }
  }
  c_prt(attr_00,pmVar1[wVar4].name,row,col);
  big_pad(L'B',row,local_32,local_38);
  if (pmVar1[wVar4].rarity == L'\0') {
    pcVar5 = format("%s","shape");
    put_str(pcVar5,row,L'F');
  }
  else {
    _Var3 = flag_has_dbg(pmVar1[wVar4].flags,0xb,1,"race->flags","RF_UNIQUE");
    if (_Var3) {
      pcVar5 = "alive";
      if (pmVar1[wVar4].max_num == '\0') {
        pcVar5 = " dead";
      }
      pcVar5 = format("%s",pcVar5);
      put_str(pcVar5,row,L'F');
    }
    else {
      pcVar5 = format("%5d",(ulong)pmVar2[wVar4].pkills);
      put_str(pcVar5,row,L'F');
    }
  }
  return;
}

Assistant:

static void display_monster(int col, int row, bool cursor, int oid)
{
	/* HACK Get the race index. (Should be a wrapper function) */
	int r_idx = default_item_id(oid);

	/* Access the race */
	struct monster_race *race = &r_info[r_idx];
	struct monster_lore *lore = &l_list[r_idx];

	/* Choose colors */
	uint8_t attr = curs_attrs[CURS_KNOWN][(int)cursor];
	uint8_t a = monster_x_attr[race->ridx];
	wchar_t c = monster_x_char[race->ridx];

	if ((tile_height != 1) && (a & 0x80)) {
		a = race->d_attr;
		c = race->d_char;
		/* If uniques are purple, make it so */
		if (OPT(player, purple_uniques) && rf_has(race->flags, RF_UNIQUE))
			a = COLOUR_VIOLET;
	}
	/* If uniques are purple, make it so */
	else if (OPT(player, purple_uniques) && !(a & 0x80) &&
			 rf_has(race->flags, RF_UNIQUE))
		a = COLOUR_VIOLET;

	/* Display the name */
	c_prt(attr, race->name, row, col);

	/* Display symbol */
	big_pad(66, row, a, c);

	/* Display kills */
	if (!race->rarity) {
		put_str(format("%s", "shape"), row, 70);
	} else if (rf_has(race->flags, RF_UNIQUE)) {
		put_str(format("%s", (race->max_num == 0)?  " dead" : "alive"),
				row, 70);
	} else {
		put_str(format("%5d", lore->pkills), row, 70);
	}
}